

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O2

void __thiscall PngInput::PngInput(PngInput *this)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"png",&local_39);
  ImageInput::ImageInput(&this->super_ImageInput,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_ImageInput)._vptr_ImageInput = (_func_int **)&PTR__PngInput_001a9648;
  (this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->pngBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lodepng::State::State(&this->state);
  this->colorConvert = false;
  this->nextScanline = 0;
  this->decodingBegun = false;
  return;
}

Assistant:

PngInput() : ImageInput("png") {}